

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceMeanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemean(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceMeanLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducemean(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducemean(this);
    this_00 = (ReduceMeanLayerParams *)operator_new(0x30);
    ReduceMeanLayerParams::ReduceMeanLayerParams(this_00);
    (this->layer_).reducemean_ = this_00;
  }
  return (ReduceMeanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMeanLayerParams* NeuralNetworkLayer::mutable_reducemean() {
  if (!has_reducemean()) {
    clear_layer();
    set_has_reducemean();
    layer_.reducemean_ = new ::CoreML::Specification::ReduceMeanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMean)
  return layer_.reducemean_;
}